

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O1

char * fits_find_match_delim(char *string,char delim)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  char *tstr;
  char *local_8;
  
  if (string == (char *)0x0) {
    return (char *)0x0;
  }
  local_8 = string;
  if (delim < ')') {
    pcVar3 = string;
    if (delim == '\"') {
      do {
        local_8 = pcVar3 + 1;
        cVar1 = *pcVar3;
        if (cVar1 == '\0') goto LAB_00120bbe;
        pcVar3 = local_8;
      } while (cVar1 != '\"');
    }
    else {
      if (delim != '\'') {
        return (char *)0x0;
      }
      do {
        local_8 = pcVar3 + 1;
        cVar1 = *pcVar3;
        if (cVar1 == '\0') goto LAB_00120bbe;
        pcVar3 = local_8;
      } while (cVar1 != '\'');
    }
    iVar2 = 0;
  }
  else if (delim == ')') {
    iVar2 = find_paren(&local_8);
  }
  else if (delim == ']') {
    iVar2 = find_bracket(&local_8);
  }
  else {
    if (delim != '}') {
      return (char *)0x0;
    }
    iVar2 = find_curlybracket(&local_8);
  }
LAB_00120bc3:
  if (iVar2 != 0) {
    return (char *)0x0;
  }
  return local_8;
LAB_00120bbe:
  iVar2 = 1;
  local_8 = string;
  goto LAB_00120bc3;
}

Assistant:

char *fits_find_match_delim(char *string, char delim)
/*
  Find matching delimiter, respecting quoting and (potentially nested) parentheses
  
  char *string - null-terminated string to be searched for delimiter
  char delim - single delimiter to search for (one of '")]} )

  returns: pointer to character after delimiter, or 0 if not found
*/
{
  char *tstr = string;
  int retval = 0;

  if (!string) return 0;
  switch (delim) {
  case '\'': retval = find_quote(&tstr); break;
  case '"':  retval = find_doublequote(&tstr); break;
  case '}':  retval = find_curlybracket(&tstr); break;
  case ']':  retval = find_bracket(&tstr); break;
  case ')':  retval = find_paren(&tstr); break;
  default: return 0; /* Invalid delimeter, return failure */
  }

  /* Delimeter not found, return failure */
  if (retval) return 0;

  /* Delimeter was found, return next position */
  return (tstr);
}